

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

DataSegment * __thiscall wabt::Module::GetDataSegment(Module *this,Var *var)

{
  DataSegment *pDVar1;
  Var *var_local;
  Module *this_local;
  
  pDVar1 = GetDataSegment(this,var);
  return pDVar1;
}

Assistant:

const DataSegment* Module::GetDataSegment(const Var& var) const {
  return const_cast<Module*>(this)->GetDataSegment(var);
}